

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3lamb_io.c
# Opt level: O3

int s3lamb_read(char *fn,float32 **out_lambda,uint32 *out_n_lambda)

{
  int iVar1;
  int32 iVar2;
  FILE *fp;
  char *pcVar3;
  int iVar4;
  uint32 swap;
  uint32 rd_chksum;
  uint32 n_lambda;
  uint32 sv_chksum;
  float32 *lambda;
  uint32 ignore;
  uint32 local_58;
  uint32 local_54;
  uint32 local_50;
  uint32 local_4c;
  float32 **local_48;
  float32 *local_40;
  uint32 local_34;
  
  local_54 = 0;
  fp = s3open(fn,"rb",&local_58);
  iVar4 = -1;
  if (fp == (FILE *)0x0) {
    return -1;
  }
  local_48 = out_lambda;
  pcVar3 = s3get_gvn_fattr("version");
  if (pcVar3 == (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3lamb_io.c"
            ,0x4f,"No version attribute for %s\n",fn);
  }
  else {
    iVar1 = strcmp(pcVar3,"1.0");
    if (iVar1 == 0) {
      pcVar3 = s3get_gvn_fattr("chksum0");
      iVar2 = bio_fread_1d(&local_40,4,&local_50,fp,local_58,&local_54);
      if (-1 < iVar2) {
        if (pcVar3 != (char *)0x0) {
          iVar2 = bio_fread(&local_4c,4,1,fp,local_58,&local_34);
          if (iVar2 != 1) {
            s3close(fp);
            return -1;
          }
          if (local_4c != local_54) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3lamb_io.c"
                    ,0x68,"Checksum error; read corrupt data.\n");
            goto LAB_001073ed;
          }
        }
        s3close(fp);
        *local_48 = local_40;
        *out_n_lambda = local_50;
        iVar4 = 0;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3lamb_io.c"
                ,0x71,"Read %s [%u array]\n",fn);
      }
      return iVar4;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3lamb_io.c"
            ,0x4b,"Version mismatch for %s, file ver: %s != reader ver: %s\n",fn,pcVar3,"1.0");
  }
LAB_001073ed:
  exit(1);
}

Assistant:

int
s3lamb_read(const char *fn,
	    float32 **out_lambda,
	    uint32 *out_n_lambda)
{
    FILE *fp;
    const char *ver;
    const char *do_chk;
    uint32 rd_chksum = 0, sv_chksum, ignore;
    float32 *lambda;
    uint32 n_lambda;
    uint32 swap;
    
    fp = s3open(fn, "rb", &swap);
    if (fp == NULL)
	return S3_ERROR;

    /* check version io */
    ver = s3get_gvn_fattr("version");
    if (ver) {
	if (strcmp(ver, LAMBDA_FILE_VERSION) != 0) {
	    E_FATAL("Version mismatch for %s, file ver: %s != reader ver: %s\n",
		    fn, ver, LAMBDA_FILE_VERSION);
	}
    }
    else {
	E_FATAL("No version attribute for %s\n", fn);
    }
    
    /* if do_chk is non-NULL, there is a checksum after the data in the file */
    do_chk = s3get_gvn_fattr("chksum0");

    if (bio_fread_1d((void **)&lambda,
		  sizeof(float32),
		  &n_lambda,
		  fp,
		  swap,
		  &rd_chksum) < 0)
	return S3_ERROR;

    if (do_chk) {
	/* See if the checksum in the file matches that which
	   was computed from the read data */

	if (bio_fread(&sv_chksum, sizeof(uint32), 1, fp, swap, &ignore) != 1) {
	    s3close(fp);

	    return S3_ERROR;
	}

	if (sv_chksum != rd_chksum) {
	    E_FATAL("Checksum error; read corrupt data.\n");
	}
    }

    s3close(fp);

    *out_lambda = lambda;
    *out_n_lambda = n_lambda;

    E_INFO("Read %s [%u array]\n", fn, n_lambda);

    return S3_SUCCESS;
}